

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
          (ImVector<ImGuiTextFilter::ImGuiTextRange> *this,ImGuiTextRange *v)

{
  int iVar1;
  ImGuiTextRange *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_RDI;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *unaff_retaddr;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data;
  iVar1 = in_RDI->Size;
  pIVar2[iVar1].b = (char *)*in_RSI;
  pIVar2[iVar1].e = (char *)in_RSI[1];
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }